

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

wchar_t tty_quotemode(EditLine *el)

{
  wchar_t wVar1;
  EditLine *el_local;
  
  if ((el->el_tty).t_mode == '\x02') {
    el_local._4_4_ = L'\0';
  }
  else {
    memcpy(&(el->el_tty).t_ts,&(el->el_tty).t_ed,0x3c);
    tty_setup_flags(el,&(el->el_tty).t_ts,L'\x02');
    wVar1 = tty_setty(el,L'\x01',&(el->el_tty).t_ts);
    if (wVar1 == L'\xffffffff') {
      el_local._4_4_ = L'\xffffffff';
    }
    else {
      (el->el_tty).t_mode = '\x02';
      el_local._4_4_ = L'\0';
    }
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
tty_quotemode(EditLine *el)
{
	if (el->el_tty.t_mode == QU_IO)
		return 0;

	el->el_tty.t_qu = el->el_tty.t_ed;

	tty_setup_flags(el, &el->el_tty.t_qu, QU_IO);

	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_qu) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = QU_IO;
	return 0;
}